

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&>
* __thiscall
Catch::ExprLhs<std::vector<int,std::allocator<int>>const&>::operator==
          (BinaryExpr<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&>
           *__return_storage_ptr__,ExprLhs<std::vector<int,std::allocator<int>>const&> *this,
          vector<int,_std::allocator<int>_> *rhs)

{
  vector<int,_std::allocator<int>_> *lhs;
  bool comparisonResult;
  StringRef local_30;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *rhs_local;
  ExprLhs<const_std::vector<int,_std::allocator<int>_>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (vector<int,_std::allocator<int>_> *)this;
  this_local = (ExprLhs<const_std::vector<int,_std::allocator<int>_>_&> *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
                 (*(vector<int,_std::allocator<int>_> **)this,rhs);
  lhs = *(vector<int,_std::allocator<int>_> **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }